

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjTransferToBigger(Rtm_Man_t *p,Rtm_Edg_t *pEdge)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((~*(uint *)pEdge & 0xf) == 0) {
    uVar5 = (*(uint *)pEdge & 0xfff) + 1;
    uVar3 = uVar5 >> 4;
    if (p->nExtraAlloc <= (int)(p->nExtraCur + uVar3)) {
      uVar1 = p->nExtraAlloc * 2;
      uVar4 = 0x400;
      if (0x400 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      if (p->pExtra == (uint *)0x0) {
        puVar2 = (uint *)malloc(uVar4 * 4);
      }
      else {
        puVar2 = (uint *)realloc(p->pExtra,uVar4 * 4);
      }
      p->pExtra = puVar2;
      p->nExtraAlloc = (int)uVar4;
    }
    memcpy(p->pExtra + p->nExtraCur,p->pExtra + (*(uint *)pEdge >> 0xc),(ulong)(uVar5 >> 2));
    p->pExtra[(ulong)uVar3 + (long)p->nExtraCur] = 0;
    *(uint *)pEdge = *(uint *)pEdge & 0xfff | p->nExtraCur << 0xc;
    p->nExtraCur = p->nExtraCur + uVar3 + 1;
    return;
  }
  __assert_fail("(pEdge->nLats & 15) == 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                ,0xc9,"void Rtm_ObjTransferToBigger(Rtm_Man_t *, Rtm_Edg_t *)");
}

Assistant:

void Rtm_ObjTransferToBigger( Rtm_Man_t * p, Rtm_Edg_t * pEdge ) 
{
    int nWords;
    assert( (pEdge->nLats & 15) == 15 );
    nWords = (pEdge->nLats + 1) >> 4;
    if ( p->nExtraCur + nWords + 1 > p->nExtraAlloc )
    {
        int nExtraAllocNew = Abc_MaxInt( 2 * p->nExtraAlloc, 1024 );
        p->pExtra = ABC_REALLOC( unsigned, p->pExtra, nExtraAllocNew );
        p->nExtraAlloc = nExtraAllocNew;
    }
    memcpy( p->pExtra + p->nExtraCur, p->pExtra + pEdge->LData, sizeof(unsigned) * nWords );
    p->pExtra[p->nExtraCur + nWords] = 0;
    pEdge->LData = p->nExtraCur;
    p->nExtraCur += nWords + 1;
}